

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::StrictMock<MockBinaryLogicalVisitor>::StrictMock
          (StrictMock<MockBinaryLogicalVisitor> *this)

{
  MockBinaryLogicalVisitor *in_RDI;
  MockBinaryLogicalVisitor *in_stack_fffffffffffffff0;
  
  MockBinaryLogicalVisitor::MockBinaryLogicalVisitor(in_stack_fffffffffffffff0);
  (in_RDI->super_ExprVisitor<MockBinaryLogicalVisitor,_TestResult>).
  super_BasicExprVisitor<MockBinaryLogicalVisitor,_TestResult,_mp::internal::ExprTypes>.
  _vptr_BasicExprVisitor = (_func_int **)&PTR__StrictMock_002a4458;
  internal::ImplicitCast_<MockBinaryLogicalVisitor*>(in_RDI);
  Mock::FailUninterestingCalls((void *)0x15943b);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }